

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::verify
          (TextureDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *v;
  Vec4 *pVVar1;
  Vec4 *pVVar2;
  ostringstream *poVar3;
  uint uVar4;
  Precision PVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  float fVar8;
  int iVar9;
  undefined8 uVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  NotSupportedError *this_00;
  Vector<float,_4> *v_00;
  float s;
  float s_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  LogVecComps local_2f8;
  Vec4 valueRamp;
  Vec4 threshold;
  Vec4 reference;
  Vec4 opThreshold;
  Vec4 scale;
  Vector<float,_4> local_268;
  Vector<float,_4> local_258;
  Vec4 *local_240;
  Vec4 surfaceThreshold;
  Vector<float,_3> local_210;
  ConstPixelBufferAccess compareArea;
  PixelBufferAccess maskArea;
  Linear2DFunctionEvaluator function;
  
  if (1 < *(int *)(ctx + 8)) {
    if (1 < *(int *)(ctx + 0xc)) {
      tcu::getSubregion(&compareArea,(ConstPixelBufferAccess *)ctx,1,1,*(int *)(ctx + 8) + -2,
                        *(int *)(ctx + 0xc) + -2);
      tcu::getSubregion(&maskArea,(PixelBufferAccess *)sig,1,1,*(int *)(sig + 8) + -2,
                        *(int *)(sig + 0xc) + -2);
      local_258.m_data[0] = 1.0;
      local_258.m_data[1] = 0.0;
      local_258.m_data[2] = 0.5;
      local_258.m_data[3] = -0.5;
      local_268.m_data[0] = 0.0;
      local_268.m_data[1] = 1.0;
      local_268.m_data[2] = 0.5;
      local_268.m_data[3] = -0.5;
      s = (float)(int)*(undefined8 *)(ctx + 8);
      s_00 = (float)(int)((ulong)*(undefined8 *)(ctx + 8) >> 0x20);
      TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&function);
      v = &(this->super_TriangleDerivateCase).m_derivScale;
      tcu::abs<float,4>((tcu *)&scale,v);
      tcu::operator/((tcu *)&surfaceThreshold,(Vector<float,_4> *)&function,
                     (Vector<float,_4> *)&scale);
      uVar4 = *(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
      if (uVar4 < 2) {
        fVar8 = s;
        if (uVar4 != 0) {
          fVar8 = s_00;
        }
        v_00 = &local_268;
        if (uVar4 == 0) {
          v_00 = &local_258;
        }
        tcu::Vector<float,_4>::Vector(&scale,v_00);
        pVVar1 = &this->m_texValueMax;
        pVVar2 = &this->m_texValueMin;
        tcu::operator-((tcu *)&opThreshold,pVVar1,pVVar2);
        tcu::operator/((tcu *)&function,(Vector<float,_4> *)&opThreshold,fVar8);
        tcu::operator*((tcu *)&reference,(Vector<float,_4> *)&function,&scale);
        PVar5 = (this->super_TriangleDerivateCase).m_precision;
        tcu::operator*((tcu *)&function,pVVar2,&scale);
        local_240 = pVVar1;
        tcu::operator*((tcu *)&threshold,pVVar1,&scale);
        getDerivateThreshold
                  ((Functional *)&opThreshold,PVar5,(Vec4 *)&function,&threshold,&reference);
        tcu::max<float,4>((tcu *)&threshold,&surfaceThreshold,(Vector<float,_4> *)&opThreshold);
        fVar8 = (float)glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
        function.matrix.m_data.m_data[0].m_data._0_8_ =
             ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar3 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,"Verifying result image.\n");
        std::operator<<((ostream *)poVar3,"\tValid derivative is ");
        valueRamp.m_data._0_8_ = &reference;
        valueRamp.m_data[2] = fVar8;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&function,(LogVecComps *)&valueRamp);
        std::operator<<((ostream *)poVar3," with threshold ");
        local_2f8.v = &threshold;
        local_2f8.numComps = (int)fVar8;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&function,&local_2f8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        pVVar1 = &(this->super_TriangleDerivateCase).m_derivBias;
        bVar7 = verifyConstantDerivate
                          (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                           (this->super_TriangleDerivateCase).m_dataType,&reference,&threshold,v,
                           pVVar1,LOG_NOTHING);
        if (bVar7) {
          function.matrix.m_data.m_data[0].m_data._0_8_ =
               ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar3 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"No incorrect derivatives found, result valid.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
          uVar10 = std::__cxx11::ostringstream::~ostringstream(poVar3);
          iVar9 = (int)CONCAT71((int7)((ulong)uVar10 >> 8),1);
        }
        else {
          function.matrix.m_data.m_data[0].m_data._0_8_ =
               ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar3 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,
                          "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                         );
          std::operator<<((ostream *)poVar3,
                          "\tVerifying each result derivative is within its range of legal result values."
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          tcu::operator-((tcu *)&valueRamp,local_240,pVVar2);
          tcu::Matrix<float,_4,_3>::Matrix(&function.matrix);
          local_2f8.numComps = (int)pVVar2->m_data[0];
          local_2f8.v = (Vec4 *)(ulong)(uint)(valueRamp.m_data[0] / s);
          tcu::Matrix<float,_4,_3>::setRow(&function.matrix,0,(Vector<float,_3> *)&local_2f8);
          local_2f8.numComps = (int)(this->m_texValueMin).m_data[1];
          local_2f8.v = (Vec4 *)((ulong)(uint)(valueRamp.m_data[1] / s_00) << 0x20);
          tcu::Matrix<float,_4,_3>::setRow(&function.matrix,1,(Vector<float,_3> *)&local_2f8);
          local_210.m_data[2] = (this->m_texValueMin).m_data[2];
          local_210.m_data[2] = local_210.m_data[2] + local_210.m_data[2];
          auVar11._4_4_ = valueRamp.m_data[2];
          auVar11._0_4_ = valueRamp.m_data[2];
          auVar11._8_4_ = valueRamp.m_data[3];
          auVar11._12_4_ = valueRamp.m_data[3];
          auVar12._4_4_ = s_00;
          auVar12._0_4_ = s;
          auVar12._8_8_ = 0;
          auVar12 = divps(auVar11,auVar12);
          local_210.m_data._0_8_ = auVar12._0_8_;
          tcu::operator/((tcu *)&local_2f8,&local_210,2.0);
          tcu::Matrix<float,_4,_3>::setRow(&function.matrix,2,(Vector<float,_3> *)&local_2f8);
          local_210.m_data[2] = (this->m_texValueMax).m_data[3];
          local_210.m_data[2] = local_210.m_data[2] + local_210.m_data[2];
          auVar13._0_8_ = CONCAT44(valueRamp.m_data[3],valueRamp.m_data[3]) ^ 0x8000000080000000;
          auVar13._8_4_ = 0x80000000;
          auVar13._12_4_ = 0x80000000;
          auVar6._4_4_ = s_00;
          auVar6._0_4_ = s;
          auVar6._8_8_ = 0;
          auVar12 = divps(auVar13,auVar6);
          local_210.m_data._0_8_ = auVar12._0_8_;
          tcu::operator/((tcu *)&local_2f8,&local_210,2.0);
          tcu::Matrix<float,_4,_3>::setRow(&function.matrix,3,(Vector<float,_3> *)&local_2f8);
          bVar7 = reverifyConstantDerivateWithFlushRelaxations
                            (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                             (this->super_TriangleDerivateCase).m_dataType,
                             (this->super_TriangleDerivateCase).m_precision,v,pVVar1,
                             &surfaceThreshold,
                             *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                             (Linear2DFunctionEvaluator *)&function.matrix);
          iVar9 = (int)CONCAT71(extraout_var_00,bVar7);
        }
      }
      else {
        pVVar1 = &this->m_texValueMax;
        pVVar2 = &this->m_texValueMin;
        tcu::operator-((tcu *)&reference,pVVar1,pVVar2);
        tcu::operator/((tcu *)&scale,(Vector<float,_4> *)&reference,s);
        tcu::operator*((tcu *)&function,(Vector<float,_4> *)&scale,&local_258);
        tcu::operator-((tcu *)&opThreshold,pVVar1,pVVar2);
        tcu::operator/((tcu *)&reference,(Vector<float,_4> *)&opThreshold,s_00);
        tcu::operator*((tcu *)&scale,(Vector<float,_4> *)&reference,&local_268);
        tcu::abs<float,4>((tcu *)&opThreshold,(Vector<float,_4> *)&function);
        tcu::abs<float,4>((tcu *)&threshold,(Vector<float,_4> *)&scale);
        tcu::operator+((tcu *)&reference,(Vector<float,_4> *)&opThreshold,
                       (Vector<float,_4> *)&threshold);
        PVar5 = (this->super_TriangleDerivateCase).m_precision;
        tcu::operator*((tcu *)&threshold,pVVar2,&local_258);
        tcu::operator*((tcu *)&valueRamp,pVVar1,&local_258);
        getDerivateThreshold
                  ((Functional *)&opThreshold,PVar5,&threshold,&valueRamp,(Vec4 *)&function);
        PVar5 = (this->super_TriangleDerivateCase).m_precision;
        tcu::operator*((tcu *)&valueRamp,pVVar2,&local_268);
        tcu::operator*((tcu *)&local_2f8,pVVar1,&local_268);
        getDerivateThreshold((Functional *)&threshold,PVar5,&valueRamp,(Vec4 *)&local_2f8,&scale);
        tcu::max<float,4>((tcu *)&local_2f8,&opThreshold,(Vector<float,_4> *)&threshold);
        tcu::max<float,4>((tcu *)&valueRamp,&surfaceThreshold,(Vector<float,_4> *)&local_2f8);
        bVar7 = verifyConstantDerivate
                          (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                           (this->super_TriangleDerivateCase).m_dataType,&reference,&valueRamp,v,
                           &(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
        iVar9 = (int)CONCAT71(extraout_var,bVar7);
      }
      return iVar9;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&function,"Too small viewport",(allocator<char> *)&compareArea);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&function);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void gen (void)
	{
		DE_ASSERT(!m_fbo);
		m_gl.genFramebuffers(1, &m_fbo);
	}